

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O3

DdNode * addBddDoThreshold(DdManager *dd,DdNode *f,DdNode *val)

{
  int *piVar1;
  DdHalfWord index;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *pDVar3;
  DdNode *T_00;
  
  if (f->index == 0x7fffffff) {
    return (DdNode *)
           ((ulong)((f->type).value <= (val->type).value && (val->type).value != (f->type).value) ^
           (ulong)dd->one);
  }
  pDVar2 = cuddCacheLookup2(dd,addBddDoThreshold,f,val);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  index = f->index;
  pDVar2 = (f->type).kids.E;
  T = addBddDoThreshold(dd,(f->type).kids.T,val);
  if (T != (DdNode *)0x0) {
    T_00 = (DdNode *)((ulong)T & 0xfffffffffffffffe);
    T_00->ref = T_00->ref + 1;
    pDVar2 = addBddDoThreshold(dd,pDVar2,val);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      if (((ulong)T & 1) == 0) {
        pDVar3 = T;
        if ((T == pDVar2) || (pDVar3 = cuddUniqueInter(dd,index,T,pDVar2), pDVar3 != (DdNode *)0x0))
        {
LAB_008065b8:
          T_00->ref = T_00->ref - 1;
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + -1;
          cuddCacheInsert2(dd,addBddDoThreshold,f,val,pDVar3);
          return pDVar3;
        }
      }
      else {
        pDVar3 = T_00;
        if ((T == pDVar2) ||
           (pDVar3 = cuddUniqueInter(dd,index,T_00,(DdNode *)((ulong)pDVar2 ^ 1)),
           pDVar3 != (DdNode *)0x0)) {
          pDVar3 = (DdNode *)((ulong)pDVar3 ^ 1);
          goto LAB_008065b8;
        }
      }
      Cudd_RecursiveDeref(dd,T);
      T = pDVar2;
    }
    Cudd_RecursiveDeref(dd,T);
  }
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
addBddDoThreshold(
  DdManager * dd,
  DdNode * f,
  DdNode * val)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        return(Cudd_NotCond(DD_ONE(dd),cuddV(f) < cuddV(val)));
    }

    /* Check cache. */
    res = cuddCacheLookup2(dd,addBddDoThreshold,f,val);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addBddDoThreshold(dd,fv,val);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addBddDoThreshold(dd,fvn,val);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);
    if (Cudd_IsComplement(T)) {
        res = (T == E) ? Cudd_Not(T) : cuddUniqueInter(dd,v,Cudd_Not(T),Cudd_Not(E));
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,addBddDoThreshold,f,val,res);

    return(res);

}